

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

void * __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
::allocate(pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
           *this)

{
  bool bVar1;
  __shared_ptr_access<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  refcount_t *chunk;
  refcount_t *chunk_2;
  shared_ptr<tchecker::collectable_t> *collectable;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  *__range3;
  refcount_t *chunk_1;
  pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  *this_local;
  
  if (this->_raw_head == this->_raw_end) {
    if (this->_free_head == (char *)0x0) {
      __end3 = std::
               vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
               ::begin(&this->_collectables);
      collectable = (shared_ptr<tchecker::collectable_t> *)
                    std::
                    vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
                    ::end(&this->_collectables);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::shared_ptr<tchecker::collectable_t>_*,_std::vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>_>
                                    *)&collectable);
        if (!bVar1) break;
        this_00 = (__shared_ptr_access<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<tchecker::collectable_t>_*,_std::vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>_>
                     ::operator*(&__end3);
        peVar2 = std::
                 __shared_ptr_access<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        (*peVar2->_vptr_collectable_t[2])();
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<tchecker::collectable_t>_*,_std::vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>_>
        ::operator++(&__end3);
      }
      collect(this);
    }
    if (this->_free_head == (char *)0x0) {
      allocate_raw_block(this);
      this_local = (pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                    *)allocate_chunk_from_raw_block(this);
      this_local->_alloc_nb = 0;
    }
    else {
      this_local = (pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                    *)allocate_chunk_from_free_list(this);
      this_local->_alloc_nb = 0;
    }
  }
  else {
    this_local = (pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                  *)allocate_chunk_from_raw_block(this);
    this_local->_alloc_nb = 0;
  }
  return this_local;
}

Assistant:

inline void * allocate()
  {
    // Allocate from the raw block if possible
    if (_raw_head != _raw_end) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate from the free list, collect first if needed
    if (_free_head == nullptr) {
      // collect unsued objects from registered collectables
      for (std::shared_ptr<tchecker::collectable_t> const & collectable : _collectables)
        collectable->collect();
      // then collect free chunks of memory
      collect();
    }

    if (_free_head != nullptr) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_free_list());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate a new raw block, and allocate from the block
    allocate_raw_block();
    typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
    *chunk = 0; // set reference counter
    return chunk;
  }